

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetMAA(void *kinmem,long maa)

{
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    error_code = -1;
  }
  else {
    if (-1 < maa) {
      if (*(long *)((long)kinmem + 0x30) < maa) {
        maa = *(long *)((long)kinmem + 0x30);
      }
      *(long *)((long)kinmem + 400) = maa;
      *(uint *)((long)kinmem + 0x198) = (uint)(maa != 0);
      return 0;
    }
    msgfmt = "maa < 0 illegal.";
    error_code = -2;
  }
  KINProcessError((KINMem)0x0,error_code,"KINSOL","KINSetMAA",msgfmt);
  return error_code;
}

Assistant:

int KINSetMAA(void *kinmem, long int maa)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetMAA", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (maa < 0) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetMAA", MSG_BAD_MAA);
    return(KIN_ILL_INPUT);
  }

  if (maa > kin_mem->kin_mxiter) maa = kin_mem->kin_mxiter;

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_m_aa = maa;
  kin_mem->kin_aamem_aa = (maa == 0) ? SUNFALSE : SUNTRUE;

  return(KIN_SUCCESS);
}